

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O3

void __thiscall mocker::ast::IntLitExpr::~IntLitExpr(IntLitExpr *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  p_Var2 = (this->super_LiteralExpr).super_Expression.super_ASTNode.
           super_enable_shared_from_this<mocker::ast::ASTNode>._M_weak_this.
           super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

explicit IntLitExpr(Integer val) : val(val) {}